

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

void Lms_ObjAreaMark_rec(Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  
  if (((*(ulong *)pObj >> 0x1e & 1) == 0) && (iVar1 = Gia_ObjIsCi(pObj), iVar1 == 0)) {
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | 0x40000000;
    pGVar2 = Gia_ObjFanin0(pObj);
    Lms_ObjAreaMark_rec(pGVar2);
    pGVar2 = Gia_ObjFanin1(pObj);
    Lms_ObjAreaMark_rec(pGVar2);
  }
  return;
}

Assistant:

void Lms_ObjAreaMark_rec( Gia_Obj_t * pObj )
{
    if ( pObj->fMark0 || Gia_ObjIsCi(pObj) )
        return;
    pObj->fMark0 = 1;
    Lms_ObjAreaMark_rec( Gia_ObjFanin0(pObj) );
    Lms_ObjAreaMark_rec( Gia_ObjFanin1(pObj) );
}